

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserDecorator.cpp
# Opt level: O0

bool __thiscall
Rml::PropertyParserDecorator::ParseValue
          (PropertyParserDecorator *this,Property *property,String *decorator_string_value,
          ParameterMap *param_3)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  size_type __n;
  reference pbVar6;
  flat_map<std::__cxx11::string,Rml::BoxArea,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>
  *this_00;
  PropertyParserDecoratorData *this_01;
  pointer ppVar7;
  undefined8 uVar8;
  char cVar9;
  ulong local_3c0;
  undefined1 local_3a0 [56];
  DecoratorDeclaration local_368;
  String local_308;
  allocator<char> local_2e1;
  String local_2e0;
  undefined1 local_2c0 [8];
  PropertyDictionary properties;
  PropertySpecification *specification;
  String shorthand;
  DecoratorInstancer *instancer;
  undefined1 local_240 [8];
  String type;
  BoxArea local_1c8;
  int local_1bc;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>_>
  local_1b8;
  String local_1b0;
  String local_190;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>_>
  local_170;
  const_iterator it;
  String *keyword;
  iterator __end3;
  iterator __begin3;
  StringList *__range3;
  undefined1 local_128 [8];
  StringList keywords;
  BoxArea paint_area;
  size_t keywords_begin;
  bool invalid_parenthesis;
  size_t shorthand_close;
  size_t shorthand_open;
  String *decorator_string;
  iterator __end1;
  iterator __begin1;
  StringList *__range1;
  DecoratorDeclarationList decorators;
  StringList decorator_string_list;
  shared_ptr<const_Rml::DecoratorDeclarationList> local_68;
  Variant local_58;
  ParameterMap *local_30;
  ParameterMap *param_3_local;
  String *decorator_string_value_local;
  Property *property_local;
  PropertyParserDecorator *this_local;
  
  local_30 = param_3;
  param_3_local = (ParameterMap *)decorator_string_value;
  decorator_string_value_local = (String *)property;
  property_local = (Property *)this;
  uVar5 = ::std::__cxx11::string::empty();
  if (((uVar5 & 1) != 0) ||
     (bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )param_3_local,"none"), bVar2)) {
    ::std::shared_ptr<const_Rml::DecoratorDeclarationList>::shared_ptr(&local_68);
    Variant::Variant<std::shared_ptr<Rml::DecoratorDeclarationList_const>,void>(&local_58,&local_68)
    ;
    Variant::operator=((Variant *)decorator_string_value_local,&local_58);
    Variant::~Variant(&local_58);
    ::std::shared_ptr<const_Rml::DecoratorDeclarationList>::~shared_ptr(&local_68);
    *(undefined4 *)&decorator_string_value_local[1]._M_string_length = 0x800000;
    this_local._7_1_ = 1;
  }
  else {
    pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(decorators.value.field_2._M_local_buf + 8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(pvVar1);
    StringUtilities::ExpandString((StringList *)pvVar1,(String *)param_3_local,',','(',')',false);
    DecoratorDeclarationList::DecoratorDeclarationList((DecoratorDeclarationList *)&__range1);
    ::std::__cxx11::string::operator=
              ((string *)
               &decorators.list.
                super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)param_3_local);
    __n = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(decorators.value.field_2._M_local_buf + 8));
    ::std::vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>::reserve
              ((vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_> *)
               &__range1,__n);
    pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(decorators.value.field_2._M_local_buf + 8);
    __end1 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(pvVar1);
    decorator_string =
         (String *)
         ::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(pvVar1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&decorator_string), bVar2) {
      pbVar6 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      cVar9 = (char)pbVar6;
      uVar5 = ::std::__cxx11::string::find(cVar9,0x28);
      local_3c0 = ::std::__cxx11::string::rfind(cVar9,0x29);
      bVar2 = true;
      if ((uVar5 != 0xffffffffffffffff) && (bVar2 = true, local_3c0 != 0xffffffffffffffff)) {
        bVar2 = local_3c0 <= uVar5;
      }
      if (bVar2) {
        local_3c0 = ::std::__cxx11::string::find(cVar9,0x20);
      }
      else {
        local_3c0 = local_3c0 + 1;
      }
      keywords.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = Auto;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_128);
      uVar5 = ::std::__cxx11::string::size();
      if (local_3c0 < uVar5) {
        ::std::__cxx11::string::substr((ulong)&__range3,(ulong)pbVar6);
        StringUtilities::ExpandString((StringList *)local_128,(String *)&__range3,' ');
        ::std::__cxx11::string::~string((string *)&__range3);
      }
      __end3 = ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_128);
      keyword = (String *)
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_128);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&keyword), bVar3) {
        it._M_current =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>
              *)__gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end3);
        uVar5 = ::std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          this_00 = (flat_map<std::__cxx11::string,Rml::BoxArea,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>
                     *)ControlledLifetimeResource<Rml::PropertyParserDecoratorData>::operator->
                                 ((ControlledLifetimeResource<Rml::PropertyParserDecoratorData> *)
                                  parser_data);
          ::std::__cxx11::string::string((string *)&local_1b0,(string *)it._M_current);
          StringUtilities::ToLower(&local_190,&local_1b0);
          local_170._M_current =
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>
                *)itlib::
                  flat_map<std::__cxx11::string,Rml::BoxArea,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>
                  ::find<std::__cxx11::string>(this_00,&local_190);
          ::std::__cxx11::string::~string((string *)&local_190);
          ::std::__cxx11::string::~string((string *)&local_1b0);
          this_01 = ControlledLifetimeResource<Rml::PropertyParserDecoratorData>::operator->
                              ((ControlledLifetimeResource<Rml::PropertyParserDecoratorData> *)
                               parser_data);
          local_1b8._M_current =
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>
                *)itlib::
                  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>_>
                  ::end(&this_01->area_keywords);
          bVar3 = __gnu_cxx::operator==(&local_170,&local_1b8);
          if (bVar3) {
            this_local._7_1_ = 0;
            local_1bc = 1;
            goto LAB_005eb39d;
          }
          ppVar7 = __gnu_cxx::
                   __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>_>_>_>
                   ::operator->(&local_170);
          keywords.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = ppVar7->second;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      local_1bc = 0;
LAB_005eb39d:
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_128);
      if (local_1bc != 0) goto LAB_005eb8d8;
      if (bVar2) {
        ::std::__cxx11::string::substr((ulong)((long)&type.field_2 + 8),(ulong)pbVar6);
        PropertyDictionary::PropertyDictionary((PropertyDictionary *)&stack0xfffffffffffffe08);
        local_1c8 = keywords.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        ::std::vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>::
        emplace_back<Rml::DecoratorDeclaration>
                  ((vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_> *)
                   &__range1,(DecoratorDeclaration *)((long)&type.field_2 + 8));
        DecoratorDeclaration::~DecoratorDeclaration
                  ((DecoratorDeclaration *)((long)&type.field_2 + 8));
      }
      else {
        ::std::__cxx11::string::substr((ulong)&instancer,(ulong)pbVar6);
        StringUtilities::StripWhitespace((String *)local_240,(String *)&instancer);
        ::std::__cxx11::string::~string((string *)&instancer);
        shorthand.field_2._8_8_ = Factory::GetDecoratorInstancer((String *)local_240);
        if ((DecoratorInstancer *)shorthand.field_2._8_8_ == (DecoratorInstancer *)0x0) {
          uVar8 = ::std::__cxx11::string::c_str();
          Log::Message(LT_WARNING,"Decorator type \'%s\' not found.",uVar8);
          this_local._7_1_ = 0;
          local_1bc = 1;
        }
        else {
          ::std::__cxx11::string::substr((ulong)&specification,(ulong)pbVar6);
          properties.properties._40_8_ =
               EffectSpecification::GetPropertySpecification
                         ((EffectSpecification *)(shorthand.field_2._8_8_ + 8));
          PropertyDictionary::PropertyDictionary((PropertyDictionary *)local_2c0);
          uVar8 = properties.properties._40_8_;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2e0,"decorator",&local_2e1);
          bVar2 = PropertySpecification::ParsePropertyDeclaration
                            ((PropertySpecification *)uVar8,(PropertyDictionary *)local_2c0,
                             &local_2e0,(String *)&specification);
          ::std::__cxx11::string::~string((string *)&local_2e0);
          ::std::allocator<char>::~allocator(&local_2e1);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
LAB_005eb712:
            PropertySpecification::SetPropertyDefaults
                      ((PropertySpecification *)properties.properties._40_8_,
                       (PropertyDictionary *)local_2c0);
            ::std::__cxx11::string::string((string *)&local_368,(string *)local_240);
            local_368.instancer = (DecoratorInstancer *)shorthand.field_2._8_8_;
            PropertyDictionary::PropertyDictionary
                      (&local_368.properties,(PropertyDictionary *)local_2c0);
            local_368.paint_area =
                 keywords.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            ::std::vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>::
            emplace_back<Rml::DecoratorDeclaration>
                      ((vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                        *)&__range1,&local_368);
            DecoratorDeclaration::~DecoratorDeclaration(&local_368);
            local_1bc = 0;
          }
          else {
            StringUtilities::StripWhitespace(&local_308,(String *)&specification);
            bVar4 = ::std::__cxx11::string::empty();
            ::std::__cxx11::string::~string((string *)&local_308);
            if (((bVar4 ^ 0xff) & 1) == 0) goto LAB_005eb712;
            this_local._7_1_ = 0;
            local_1bc = 1;
          }
          PropertyDictionary::~PropertyDictionary((PropertyDictionary *)local_2c0);
          ::std::__cxx11::string::~string((string *)&specification);
        }
        ::std::__cxx11::string::~string((string *)local_240);
        if (local_1bc != 0) goto LAB_005eb8d8;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    bVar2 = ::std::vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>::
            empty((vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_> *)
                  &__range1);
    if (bVar2) {
      this_local._7_1_ = 0;
      local_1bc = 1;
    }
    else {
      MakeShared<Rml::DecoratorDeclarationList,Rml::DecoratorDeclarationList>
                ((DecoratorDeclarationList *)local_3a0);
      Variant::Variant<std::shared_ptr<Rml::DecoratorDeclarationList>,void>
                ((Variant *)(local_3a0 + 0x10),
                 (shared_ptr<Rml::DecoratorDeclarationList> *)local_3a0);
      Variant::operator=((Variant *)decorator_string_value_local,(Variant *)(local_3a0 + 0x10));
      Variant::~Variant((Variant *)(local_3a0 + 0x10));
      ::std::shared_ptr<Rml::DecoratorDeclarationList>::~shared_ptr
                ((shared_ptr<Rml::DecoratorDeclarationList> *)local_3a0);
      *(undefined4 *)&decorator_string_value_local[1]._M_string_length = 0x800000;
      this_local._7_1_ = 1;
      local_1bc = 1;
    }
LAB_005eb8d8:
    DecoratorDeclarationList::~DecoratorDeclarationList((DecoratorDeclarationList *)&__range1);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(decorators.value.field_2._M_local_buf + 8));
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool PropertyParserDecorator::ParseValue(Property& property, const String& decorator_string_value, const ParameterMap& /*parameters*/) const
{
	// Decorators are declared as
	//   decorator: <decorator-value>[, <decorator-value> ...];
	// Where <decorator-value> is either a @decorator name:
	//   decorator: invader-theme-background <paint-area>?, ...;
	// or is an anonymous decorator with inline properties
	//   decorator: tiled-box( <shorthand properties> ) <paint-area>?, ...;
	// where <paint-area> is one of
	//   border-box, padding-box, content-box

	if (decorator_string_value.empty() || decorator_string_value == "none")
	{
		property.value = Variant(DecoratorsPtr());
		property.unit = Unit::DECORATOR;
		return true;
	}

	RMLUI_ZoneScoped;

	// Make sure we don't split inside the parenthesis since they may appear in decorator shorthands.
	StringList decorator_string_list;
	StringUtilities::ExpandString(decorator_string_list, decorator_string_value, ',', '(', ')');

	DecoratorDeclarationList decorators;
	decorators.value = decorator_string_value;
	decorators.list.reserve(decorator_string_list.size());

	// Get or instance each decorator in the comma-separated string list
	for (const String& decorator_string : decorator_string_list)
	{
		const size_t shorthand_open = decorator_string.find('(');
		const size_t shorthand_close = decorator_string.rfind(')');
		const bool invalid_parenthesis = (shorthand_open == String::npos || shorthand_close == String::npos || shorthand_open >= shorthand_close);
		const size_t keywords_begin = (invalid_parenthesis ? decorator_string.find(' ') : shorthand_close + 1);

		// Look-up keywords for customized paint area.
		BoxArea paint_area = BoxArea::Auto;

		{
			StringList keywords;
			if (keywords_begin < decorator_string.size())
				StringUtilities::ExpandString(keywords, decorator_string.substr(keywords_begin), ' ');

			for (const String& keyword : keywords)
			{
				if (keyword.empty())
					continue;

				auto it = parser_data->area_keywords.find(StringUtilities::ToLower(keyword));
				if (it == parser_data->area_keywords.end())
					return false; // Bail out if we have an invalid keyword.

				paint_area = it->second;
			}
		}

		if (invalid_parenthesis)
		{
			// We found no parenthesis, that means the value must be a name of a @decorator rule.
			decorators.list.emplace_back(DecoratorDeclaration{decorator_string.substr(0, keywords_begin), nullptr, {}, paint_area});
		}
		else
		{
			// Since we have parentheses it must be an anonymous decorator with inline properties
			const String type = StringUtilities::StripWhitespace(decorator_string.substr(0, shorthand_open));

			// Check for valid decorator type
			DecoratorInstancer* instancer = Factory::GetDecoratorInstancer(type);
			if (!instancer)
			{
				Log::Message(Log::LT_WARNING, "Decorator type '%s' not found.", type.c_str());
				return false;
			}

			const String shorthand = decorator_string.substr(shorthand_open + 1, shorthand_close - shorthand_open - 1);
			const PropertySpecification& specification = instancer->GetPropertySpecification();

			// Parse the shorthand properties given by the 'decorator' shorthand property
			PropertyDictionary properties;
			if (!specification.ParsePropertyDeclaration(properties, "decorator", shorthand))
			{
				// Empty values are allowed in decorators, if the value is not empty we must have encountered a parser error.
				if (!StringUtilities::StripWhitespace(shorthand).empty())
					return false;
			}

			// Set unspecified values to their defaults
			specification.SetPropertyDefaults(properties);

			decorators.list.emplace_back(DecoratorDeclaration{type, instancer, std::move(properties), paint_area});
		}
	}

	if (decorators.list.empty())
		return false;

	property.value = Variant(MakeShared<DecoratorDeclarationList>(std::move(decorators)));
	property.unit = Unit::DECORATOR;

	return true;
}